

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O3

void xmlSAX2EndElementNs(void *ctx,xmlChar *localname,xmlChar *prefix,xmlChar *URI)

{
  xmlNodePtr elem;
  long lVar1;
  xmlDocPtr doc;
  uint uVar2;
  xmlParserCtxtPtr ctxt;
  xmlParserNodeInfo node_info;
  xmlParserNodeInfo local_38;
  
  if (ctx != (void *)0x0) {
    elem = *(xmlNodePtr *)((long)ctx + 0x50);
    if (elem != (xmlNodePtr)0x0 && *(int *)((long)ctx + 0x68) != 0) {
      lVar1 = *(long *)((long)ctx + 0x38);
      local_38.end_pos = *(long *)(lVar1 + 0x20) - *(long *)(lVar1 + 0x18);
      local_38.end_line = (unsigned_long)*(int *)(lVar1 + 0x34);
      local_38.node = elem;
      xmlParserAddNodeInfo((xmlParserCtxtPtr)ctx,&local_38);
    }
    *(undefined4 *)((long)ctx + 0x1a0) = 0xffffffff;
    if ((((*(int *)((long)ctx + 0x9c) != 0) && (*(int *)((long)ctx + 0x18) != 0)) &&
        (doc = *(xmlDocPtr *)((long)ctx + 0x10), doc != (xmlDocPtr)0x0)) &&
       (doc->intSubset != (_xmlDtd *)0x0)) {
      uVar2 = xmlValidateOneElement((xmlValidCtxtPtr)((long)ctx + 0xa0),doc,elem);
      *(uint *)((long)ctx + 0x98) = *(uint *)((long)ctx + 0x98) & uVar2;
    }
    nodePop((xmlParserCtxtPtr)ctx);
  }
  return;
}

Assistant:

void
xmlSAX2EndElementNs(void *ctx,
                    const xmlChar * localname ATTRIBUTE_UNUSED,
                    const xmlChar * prefix ATTRIBUTE_UNUSED,
		    const xmlChar * URI ATTRIBUTE_UNUSED)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlParserNodeInfo node_info;
    xmlNodePtr cur;

    if (ctx == NULL) return;
    cur = ctxt->node;
    /* Capture end position and add node */
    if ((ctxt->record_info) && (cur != NULL)) {
        node_info.end_pos = ctxt->input->cur - ctxt->input->base;
        node_info.end_line = ctxt->input->line;
        node_info.node = cur;
        xmlParserAddNodeInfo(ctxt, &node_info);
    }
    ctxt->nodemem = -1;

#ifdef LIBXML_VALID_ENABLED
    if (ctxt->validate && ctxt->wellFormed &&
        ctxt->myDoc && ctxt->myDoc->intSubset)
        ctxt->valid &= xmlValidateOneElement(&ctxt->vctxt, ctxt->myDoc, cur);
#endif /* LIBXML_VALID_ENABLED */

    /*
     * end of parsing of this node.
     */
    nodePop(ctxt);
}